

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

problem_solver_type __thiscall baryonyx::problem::which_problem_type(problem *this)

{
  bool bVar1;
  int iVar2;
  int coefficient;
  problem *this_local;
  
  iVar2 = coefficient_type(this);
  bVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::empty
                    (&this->greater_constraints);
  if ((bVar1) &&
     (bVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::empty
                        (&this->less_constraints), bVar1)) {
    if (iVar2 == 0) {
      this_local._4_4_ = equalities_01;
    }
    else if (iVar2 == 1) {
      this_local._4_4_ = equalities_101;
    }
    else {
      this_local._4_4_ = equalities_Z;
    }
  }
  else if (iVar2 == 0) {
    this_local._4_4_ = inequalities_01;
  }
  else if (iVar2 == 1) {
    this_local._4_4_ = inequalities_101;
  }
  else {
    this_local._4_4_ = inequalities_Z;
  }
  return this_local._4_4_;
}

Assistant:

problem_solver_type which_problem_type() noexcept
    {
        auto coefficient = coefficient_type();

        if (greater_constraints.empty() && less_constraints.empty()) {
            switch (coefficient) {
            case 0:
                return problem_solver_type::equalities_01;
            case 1:
                return problem_solver_type::equalities_101;
            default:
                return problem_solver_type::equalities_Z;
            }
        } else {
            switch (coefficient) {
            case 0:
                return problem_solver_type::inequalities_01;
            case 1:
                return problem_solver_type::inequalities_101;
            default:
                return problem_solver_type::inequalities_Z;
            }
        }

        return problem_solver_type::inequalities_Z;
    }